

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

int __thiscall
JsUtil::
List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
          (List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *this,LoopEntryPointInfo **item)

{
  WriteBarrierPtr<Js::LoopEntryPointInfo> *addr;
  int iVar1;
  LoopEntryPointInfo *pLVar2;
  
  EnsureArray(this,0);
  pLVar2 = *item;
  addr = (this->super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>).
         buffer.ptr +
         (this->super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>).
         count;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pLVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  iVar1 = (this->super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>).
          count;
  (this->super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>).count =
       iVar1 + 1;
  return iVar1;
}

Assistant:

int Add(const T& item)
        {
            EnsureArray();
            this->buffer[this->count] = item;
            int pos = this->count;
            this->count++;
            return pos;
        }